

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O2

void process_args(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  char *pcVar5;
  allocator<char> local_1bd;
  int option_index;
  string local_1b8;
  option long_options [11];
  
  memcpy(long_options,&PTR_anon_var_dwarf_95a2_001b7340,0x160);
  poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar2 = std::operator<<(poVar2,*argv);
  poVar2 = std::operator<<(poVar2," [arguments]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"valid arguments:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-a --inputdirfg sets the input directory for foreground frames");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-b --inputdirbg sets the input directory for background frames");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-o --outputdir sets the directory for output frames");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-s --shader sets the filename of the fragment shader");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-f --filetype sets the filetype (only tested with png so far)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-n --numframes sets the number of frames to store in memory at once");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t(defaults to 8)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-d --delay sets the delay for processed_older frame, only affects some filters"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t(defaults to 1)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"-w --width sets the frame width in pixels");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"-h --height sets the frame height in pixels");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t(defaults to 1280x720)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-c --swap swaps the foreground/background inputs to the shader");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-p --preview run in preview mode, don\'t save images just play the effect"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  option_index = 0;
LAB_0010b8ac:
  iVar1 = getopt_long(argc,argv,"a:b:o:s:f:n:d:w:h:cp",long_options,&option_index);
  switch(iVar1) {
  case 0x61:
    std::__cxx11::string::assign((char *)&input_dir_fg_abi_cxx11_);
    if (input_dir_fg_abi_cxx11_._M_dataplus._M_p[input_dir_fg_abi_cxx11_._M_string_length - 1] !=
        '/') {
      poVar2 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory.");
      pcVar5 = " pls try again";
      goto LAB_0010bb74;
    }
    goto LAB_0010b8ac;
  case 0x62:
    std::__cxx11::string::assign((char *)&input_dir_bg_abi_cxx11_);
    sVar3 = input_dir_bg_abi_cxx11_._M_string_length;
    _Var4 = input_dir_bg_abi_cxx11_._M_dataplus;
    goto LAB_0010b9df;
  case 99:
    swap_fg_bg = true;
    poVar2 = (ostream *)&std::cout;
    pcVar5 = "swapping foreground and background";
    goto LAB_0010baf4;
  case 100:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,_optarg,&local_1bd);
    num_frames_back = std::__cxx11::stoi(&local_1b8,(size_t *)0x0,10);
    break;
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x76:
    goto switchD_0010b8d0_caseD_65;
  case 0x66:
    std::__cxx11::string::assign((char *)&out_filetype_abi_cxx11_);
    std::__cxx11::string::assign((char *)&in_filetype_abi_cxx11_);
    goto LAB_0010b8ac;
  case 0x68:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,_optarg,&local_1bd);
    iVar1 = std::__cxx11::stoi(&local_1b8,(size_t *)0x0,10);
    res.y = (float)iVar1;
    break;
  case 0x6e:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,_optarg,&local_1bd);
    batch_size = std::__cxx11::stoi(&local_1b8,(size_t *)0x0,10);
    break;
  case 0x6f:
    std::__cxx11::string::assign((char *)&output_dir_abi_cxx11_);
    sVar3 = output_dir_abi_cxx11_._M_string_length;
    _Var4 = output_dir_abi_cxx11_._M_dataplus;
LAB_0010b9df:
    if (_Var4._M_p[sVar3 - 1] != '/') {
      poVar2 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory. ");
      pcVar5 = "pls try again";
LAB_0010bb74:
      poVar2 = std::operator<<(poVar2,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
      abort();
    }
    goto LAB_0010b8ac;
  case 0x70:
    preview_mode = true;
    poVar2 = (ostream *)&std::cout;
    pcVar5 = "running in preview mode - no saving images";
LAB_0010baf4:
    poVar2 = std::operator<<(poVar2,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    goto LAB_0010b8ac;
  case 0x73:
    std::__cxx11::string::assign((char *)&frag_path_abi_cxx11_);
    if (frag_path_abi_cxx11_._M_dataplus._M_p[frag_path_abi_cxx11_._M_string_length - 1] == '/') {
      poVar2 = std::operator<<((ostream *)&std::cout,"u specified a directory, ");
      pcVar5 = "pls specify the frag shader filename instead";
      goto LAB_0010bb74;
    }
    goto LAB_0010b8ac;
  case 0x77:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,_optarg,&local_1bd);
    iVar1 = std::__cxx11::stoi(&local_1b8,(size_t *)0x0,10);
    res.x = (float)iVar1;
    break;
  default:
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"idk what this means, something\'s funny with "
                              );
      pcVar5 = " ur args";
      goto LAB_0010baf4;
    }
    if (iVar1 != 0x3f) {
      if (iVar1 == -1) {
        return;
      }
switchD_0010b8d0_caseD_65:
      abort();
    }
    goto LAB_0010b8ac;
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  goto LAB_0010b8ac;
}

Assistant:

void process_args(int argc, char* argv[]) {
	struct option long_options[] = {
		/* These options don’t set a flag.
		 We distinguish them by their indices. */
		{"inputdirfg", required_argument, 0, 'a'},
		{"inputdirbg", required_argument, 0, 'b'},
		{"outputdir", required_argument, 0, 'o'},
		{"shader", required_argument, 0, 's'},
		{"filetype", required_argument, 0, 'f'},
		{"numframes", required_argument, 0, 'n'},
		{"delay", required_argument, 0, 'd'},
		{"width", required_argument, 0, 'w'},
		{"height", required_argument, 0, 'h'},
		{"swap", no_argument, 0, 'c'},
		{"preview", no_argument, 0, 'p'}
	};

	std::cout << "Usage: " << argv[0] << " [arguments]" << std::endl;
	std::cout << "valid arguments:" << std::endl;
	std::cout << "-a --inputdirfg sets the input directory for foreground frames" << std::endl;
	std::cout << "-b --inputdirbg sets the input directory for background frames" << std::endl;
	std::cout << "-o --outputdir sets the directory for output frames" << std::endl;
	std::cout << "-s --shader sets the filename of the fragment shader" << std::endl;
	std::cout << "-f --filetype sets the filetype (only tested with png so far)" << std::endl;
	std::cout << "-n --numframes sets the number of frames to store in memory at once" << std::endl;
	std::cout << "\t(defaults to 8)" << std::endl;
	std::cout << "-d --delay sets the delay for processed_older frame, only affects some filters" << std::endl;
	std::cout << "\t(defaults to 1)" << std::endl;
	std::cout << "-w --width sets the frame width in pixels" << std::endl;
	std::cout << "-h --height sets the frame height in pixels" << std::endl;
	std::cout << "\t(defaults to 1280x720)" << std::endl;
	std::cout << "-c --swap swaps the foreground/background inputs to the shader" << std::endl;
	std::cout << "-p --preview run in preview mode, don't save images just play the effect" << std::endl;

	/* getopt_long stores the option index here. */
	int option_index = 0;
	int c;
	while (
		(c = getopt_long(
			argc,
			argv,
			"a:b:o:s:f:n:d:w:h:cp",
			long_options,
			&option_index)
		) != -1)
	{
		switch (c) {
			case 0:
				std::cout << "idk what this means, something's funny with "
					<< " ur args" << std::endl;
				break;
			case 'a':
				input_dir_fg = optarg;
				if (input_dir_fg[input_dir_fg.size()-1] != '/') {
					std::cout << "u specified a file, not a directory."
						<< " pls try again" << std::endl;
					abort();
				}
				break;
			case 'b':
				input_dir_bg = optarg;
				if (input_dir_bg[input_dir_bg.size()-1] != '/') {
					std::cout << "u specified a file, not a directory. "
						<< "pls try again" << std::endl;
					abort();
				}
				break;
			case 'o':
				output_dir = optarg;
				if (output_dir[output_dir.size()-1] != '/') {
					std::cout << "u specified a file, not a directory. "
						<< "pls try again" << std::endl;
					abort();
				}
				break;
			case 's':
				frag_path = optarg;
				if (frag_path[frag_path.size()-1] == '/') {
					std::cout << "u specified a directory, "
						<< "pls specify the frag shader filename instead"
						<< std::endl;
					abort();
				}
				break;
			case 'f':
				out_filetype = optarg;
				in_filetype = optarg;
				break;
			case 'n':
				batch_size = std::stoi(optarg);
				break;
			case 'd':
				num_frames_back = std::stoi(optarg);
				break;
			case 'w':
				res.x = std::stoi(optarg);
				break;
			case 'h':
				res.y = std::stoi(optarg);
				break;
			case 'c':
				swap_fg_bg = true;
				std::cout << "swapping foreground and background" << std::endl;
				break;
			case 'p':
				preview_mode = true;
				std::cout << "running in preview mode - no saving images"
					<< std::endl;
				break;
			case '?':
			  break;

			default:
			  abort ();
		}
	}
}